

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

bool DockNodeIsDropAllowedOne(ImGuiWindow *payload,ImGuiWindow *host_window)

{
  ImGuiWindow **ppIVar1;
  ImGuiID IVar2;
  ImGuiID IVar3;
  ImGuiDockNode *pIVar4;
  ImGuiWindow *pIVar5;
  bool bVar6;
  bool bVar7;
  long lVar8;
  ImGuiWindowClass *pIVar9;
  ImGuiWindow *pIVar10;
  
  pIVar4 = host_window->DockNodeAsHost;
  if (((pIVar4 != (ImGuiDockNode *)0x0) && ((pIVar4->MergedFlags & 0x400) != 0)) &&
     (payload->BeginOrderWithinContext < host_window->BeginOrderWithinContext)) {
    return false;
  }
  pIVar9 = &host_window->WindowClass;
  if (pIVar4 != (ImGuiDockNode *)0x0) {
    pIVar9 = &pIVar4->WindowClass;
  }
  IVar2 = pIVar9->ClassId;
  IVar3 = (payload->WindowClass).ClassId;
  if (IVar2 == IVar3) {
    lVar8 = (long)(GImGui->OpenPopupStack).Size;
    bVar7 = lVar8 < 1;
    if (0 < lVar8) {
      do {
        pIVar5 = (GImGui->OpenPopupStack).Data[lVar8 + -1].Window;
        if (pIVar5 != (ImGuiWindow *)0x0) {
          if (payload->RootWindow == pIVar5) {
            return false;
          }
          pIVar10 = payload;
          if (payload != (ImGuiWindow *)0x0) {
            do {
              if (pIVar10 == pIVar5) {
                return false;
              }
              ppIVar1 = &pIVar10->ParentWindowInBeginStack;
              pIVar10 = *ppIVar1;
            } while (*ppIVar1 != (ImGuiWindow *)0x0);
          }
        }
        bVar7 = lVar8 < 2;
        bVar6 = 1 < lVar8;
        lVar8 = lVar8 + -1;
      } while (bVar6);
    }
  }
  else if (((IVar2 == 0) || (IVar3 != 0)) || (bVar7 = true, pIVar9->DockingAllowUnclassed == false))
  {
    if (IVar3 == 0) {
      return false;
    }
    if (IVar2 != 0) {
      return false;
    }
    bVar7 = true;
    if ((payload->WindowClass).DockingAllowUnclassed == false) {
      return false;
    }
  }
  return bVar7;
}

Assistant:

static bool DockNodeIsDropAllowedOne(ImGuiWindow* payload, ImGuiWindow* host_window)
{
    if (host_window->DockNodeAsHost && host_window->DockNodeAsHost->IsDockSpace() && payload->BeginOrderWithinContext < host_window->BeginOrderWithinContext)
        return false;

    ImGuiWindowClass* host_class = host_window->DockNodeAsHost ? &host_window->DockNodeAsHost->WindowClass : &host_window->WindowClass;
    ImGuiWindowClass* payload_class = &payload->WindowClass;
    if (host_class->ClassId != payload_class->ClassId)
    {
        if (host_class->ClassId != 0 && host_class->DockingAllowUnclassed && payload_class->ClassId == 0)
            return true;
        if (payload_class->ClassId != 0 && payload_class->DockingAllowUnclassed && host_class->ClassId == 0)
            return true;
        return false;
    }

    // Prevent docking any window created above a popup
    // Technically we should support it (e.g. in the case of a long-lived modal window that had fancy docking features),
    // by e.g. adding a 'if (!ImGui::IsWindowWithinBeginStackOf(host_window, popup_window))' test.
    // But it would requires more work on our end because the dock host windows is technically created in NewFrame()
    // and our ->ParentXXX and ->RootXXX pointers inside windows are currently mislading or lacking.
    ImGuiContext& g = *GImGui;
    for (int i = g.OpenPopupStack.Size - 1; i >= 0; i--)
        if (ImGuiWindow* popup_window = g.OpenPopupStack[i].Window)
            if (ImGui::IsWindowWithinBeginStackOf(payload, popup_window))   // Payload is created from within a popup begin stack.
                return false;

    return true;
}